

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_raytracing_groups
          (Impl *this,Value *groups,VkRayTracingShaderGroupCreateInfoKHR **out_info)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  ConstValueIterator pGVar4;
  Type pGVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *group;
  ConstValueIterator itr;
  VkRayTracingShaderGroupCreateInfoKHR *state;
  VkRayTracingShaderGroupCreateInfoKHR **out_info_local;
  Value *groups_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(groups);
  itr = (ConstValueIterator)
        ScratchAllocator::allocate_n_cleared<VkRayTracingShaderGroupCreateInfoKHR>
                  (&this->allocator,(ulong)SVar2);
  *out_info = (VkRayTracingShaderGroupCreateInfoKHR *)itr;
  group = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Begin(groups);
  do {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(groups);
    if (group == pGVar4) {
      return true;
    }
    (itr->data_).s.length = 0x3b9d1400;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)group,"intersectionShader");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    itr[2].data_.s.length = uVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)group,"anyHitShader");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    *(uint *)((long)&itr[1].data_ + 0xc) = uVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)group,"closestHitShader");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    *(uint *)((long)&itr[1].data_ + 8) = uVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)group,"generalShader");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    itr[1].data_.s.hashcode = uVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)group,"type");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar5);
    itr[1].data_.s.length = uVar3;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(group,"pNext");
    if (bVar1) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)group,"pNext");
      bVar1 = parse_pnext_chain(this,pGVar5,&(itr->data_).s.str,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) {
        return false;
      }
    }
    group = group + 1;
    itr = itr + 3;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_raytracing_groups(const Value &groups,
                                                  const VkRayTracingShaderGroupCreateInfoKHR **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkRayTracingShaderGroupCreateInfoKHR>(groups.Size());
	*out_info = state;

	for (auto itr = groups.Begin(); itr != groups.End(); ++itr, state++)
	{
		auto &group = *itr;
		state->sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
		state->intersectionShader = group["intersectionShader"].GetUint();
		state->anyHitShader = group["anyHitShader"].GetUint();
		state->closestHitShader = group["closestHitShader"].GetUint();
		state->generalShader = group["generalShader"].GetUint();
		state->type = static_cast<VkRayTracingShaderGroupTypeKHR>(group["type"].GetUint());

		if (group.HasMember("pNext"))
			if (!parse_pnext_chain(group["pNext"], &state->pNext))
				return false;
	}

	return true;
}